

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

void __thiscall CVmMemorySourceList::add_block(CVmMemorySourceList *this)

{
  CVmMemorySourceBlock *this_00;
  long in_RDI;
  CVmMemorySourceBlock *b;
  long ofs;
  undefined8 local_38;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_38 = 0;
  }
  else {
    local_38 = *(long *)(*(long *)(in_RDI + 0x30) + 8) + 0x1000;
  }
  this_00 = (CVmMemorySourceBlock *)operator_new(0x1010);
  CVmMemorySourceBlock::CVmMemorySourceBlock(this_00,local_38);
  if (*(long *)(in_RDI + 0x30) == 0) {
    *(CVmMemorySourceBlock **)(in_RDI + 0x28) = this_00;
  }
  else {
    **(undefined8 **)(in_RDI + 0x30) = this_00;
  }
  *(CVmMemorySourceBlock **)(in_RDI + 0x30) = this_00;
  return;
}

Assistant:

void add_block()
    {
        long ofs = last_block_ == 0 ? 0 : last_block_->ofs + BlockLen;
        CVmMemorySourceBlock *b = new CVmMemorySourceBlock(ofs);

        if (last_block_ != 0)
            last_block_->nxt = b;
        else
            first_block_ = b;
        last_block_ = b;
    }